

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select_min.hpp
# Opt level: O1

__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
 burst::
 select_min<__gnu_cxx::__normal_iterator<boost::iterator_range<int_const*>*,std::vector<boost::iterator_range<int_const*>,std::allocator<boost::iterator_range<int_const*>>>>,burst::compose_fn<burst::apply_fn<std::less<void>>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>>
           (__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
            first,__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
                  last,
           compose_fn<burst::apply_fn<std::less<void>_>,_burst::compose_fn<burst::by_all_fn<burst::front_t>,_burst::forward_as_tuple_fn>_>
           compare)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
  _Var4;
  iterator_range<const_int_*> *piVar5;
  __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
  _Var6;
  iterator_range<const_int_*> *local_68;
  iterator_range<const_int_*> *piStack_60;
  iterator_range<const_int_*> *local_58;
  iterator_range<const_int_*> *local_50;
  int *local_48;
  int *local_40;
  undefined1 local_32 [2];
  
  if (first._M_current != last._M_current) {
    piVar5 = first._M_current + 1;
    if (piVar5 != last._M_current) {
      _Var4._M_current = first._M_current;
      _Var6._M_current = first._M_current;
      local_58 = last._M_current;
      local_50 = first._M_current;
      do {
        local_68 = _Var4._M_current;
        piStack_60 = piVar5;
        detail::
        by_all_impl<0ul,1ul,burst::front_t,std::tuple<boost::iterator_range<int_const*>&,boost::iterator_range<int_const*>&>>
                  (&local_48,local_32,&local_68);
        if (*local_40 < *local_48) {
          piVar1 = ((_Var6._M_current)->
                   super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
                   ).
                   super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
                   .
                   super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                   .m_Begin;
          piVar2 = ((_Var6._M_current)->
                   super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
                   ).
                   super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
                   .
                   super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                   .m_End;
          piVar3 = (piVar5->
                   super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
                   ).
                   super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
                   .
                   super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                   .m_End;
          ((_Var6._M_current)->
          super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>).
          super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
          super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.
          m_Begin = (piVar5->
                    super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
                    ).
                    super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
                    .
                    super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                    .m_Begin;
          ((_Var6._M_current)->
          super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>).
          super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
          super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.
          m_End = piVar3;
          (piVar5->
          super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>).
          super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
          super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.
          m_Begin = piVar1;
          (piVar5->
          super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>).
          super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
          super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.
          m_End = piVar2;
          first._M_current = _Var6._M_current;
        }
        else {
          local_68 = piVar5;
          piStack_60 = _Var4._M_current;
          detail::
          by_all_impl<0ul,1ul,burst::front_t,std::tuple<boost::iterator_range<int_const*>&,boost::iterator_range<int_const*>&>>
                    (&local_48,local_32,&local_68);
          first._M_current = _Var4._M_current;
          _Var6._M_current = local_50;
          if ((*local_48 <= *local_40) &&
             (first._M_current = _Var4._M_current + 1, piVar5 + -1 != _Var4._M_current)) {
            piVar1 = ((first._M_current)->
                     super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
                     ).
                     super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
                     .
                     super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                     .m_Begin;
            piVar2 = _Var4._M_current[1].
                     super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
                     .
                     super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
                     .
                     super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                     .m_End;
            piVar3 = (piVar5->
                     super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
                     ).
                     super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
                     .
                     super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                     .m_End;
            ((first._M_current)->
            super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>).
            super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
            super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.
            m_Begin = (piVar5->
                      super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
                      ).
                      super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
                      .
                      super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                      .m_Begin;
            _Var4._M_current[1].
            super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>.
            super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
            super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.
            m_End = piVar3;
            (piVar5->
            super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>).
            super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
            super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.
            m_Begin = piVar1;
            (piVar5->
            super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>).
            super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
            super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.
            m_End = piVar2;
          }
        }
        piVar5 = piVar5 + 1;
        _Var4._M_current = first._M_current;
      } while (piVar5 != local_58);
    }
    first._M_current = first._M_current + 1;
  }
  return (__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
          )first._M_current;
}

Assistant:

auto select_min (ForwardIterator first, ForwardIterator last, BinaryPredicate compare)
    {
        if (first != last)
        {
            auto min = first;

            for (auto current = std::next(first); current != last; ++current)
            {
                if (compare(*current, *min))
                {
                    std::iter_swap(first, current);
                    min = first;
                }
                else if (not compare(*min, *current))
                {
                    ++min;
                    if (min != current)
                    {
                        std::iter_swap(min, current);
                    }
                }
            }

            return ++min;
        }

        return first;
    }